

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O1

void __thiscall
VTKUnstructuredGrid<MercuryParticle<2ul>>::write<MercuryTimeStep<2ul>>
          (VTKUnstructuredGrid<MercuryParticle<2ul>> *this,MercuryTimeStep<2UL> *container)

{
  ostream *poVar1;
  pointer pMVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  MercuryParticle<2UL> *mem;
  pointer pMVar6;
  MercuryParticle<2UL> *mem_1;
  MercuryTimeStep<2UL> *__range2;
  char *local_78;
  long local_70;
  char local_68 [16];
  long *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  poVar1 = (ostream *)(this + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<?xml version=\"1.0\"?>\n<VTKFile type=\"UnstructuredGrid\" version=\"0.1\" byte_order=\"LittleEndian\">\n <UnstructuredGrid>\n  <Piece NumberOfPoints=\""
             ,0x8d);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "\" NumberOfCells=\"0\">\n   <Cells>\n    <DataArray type=\"Int32\" name=\"connectivity\" format=\"ascii\">\n       0\n    </DataArray>\n    <DataArray type=\"Float32\" name=\"offset\" format=\"ascii\">\n       0\n    </DataArray>\n    <DataArray type=\"UInt8\" name=\"types\" format=\"ascii\">\n       1\n    </DataArray>\n   </Cells>\n   <Points>\n"
             ,0x13b);
  plVar5 = *(long **)(*(long *)this + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<DataArray type=\"",0x11);
  (**(code **)(*plVar5 + 0x18))(&local_78,plVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_78,local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" NumberOfComponents=\"",0x16);
  (**(code **)(*plVar5 + 0x20))(plVar5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" format=\"ascii\">\n",0x12);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  pMVar2 = (container->storage_).
           super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar6 = (container->storage_).
                super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar6 != pMVar2; pMVar6 = pMVar6 + 1) {
    (**(code **)(*plVar5 + 0x10))(plVar5,poVar1,pMVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n</DataArray>\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    </Points>\n    <PointData>\n",0x1e)
  ;
  plVar5 = (long *)**(long **)this;
  local_58 = (long *)(*(long **)this)[1];
  if (plVar5 != local_58) {
    do {
      plVar3 = (long *)*plVar5;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<DataArray type=\"",0x11);
      (**(code **)(*plVar3 + 0x18))(&local_78,plVar3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_78,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" Name=\"",8);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,plVar3[1],plVar3[2] + plVar3[1])
      ;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" NumberOfComponents=\"",0x16);
      (**(code **)(*plVar3 + 0x20))(plVar3);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" format=\"ascii\">\n",0x12);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      pMVar2 = (container->storage_).
               super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pMVar6 = (container->storage_).
                    super__Vector_base<MercuryParticle<2UL>,_std::allocator<MercuryParticle<2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pMVar6 != pMVar2; pMVar6 = pMVar6 + 1
          ) {
        (**(code **)(*plVar3 + 0x10))(plVar3,poVar1,pMVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n</DataArray>\n",0xe);
      plVar5 = plVar5 + 1;
    } while (plVar5 != local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "   </PointData>\n   <CellData/>\n  </Piece>\n </UnstructuredGrid>\n</VTKFile>\n",0x4a)
  ;
  return;
}

Assistant:

void write(const C& container)
  {
    outFile_ <<
      "<?xml version=\"1.0\"?>\n"
       "<VTKFile type=\"UnstructuredGrid\" version=\"0.1\" byte_order=\"LittleEndian\">\n"
       " <UnstructuredGrid>\n"
       "  <Piece NumberOfPoints=\"" << container.size() << "\" NumberOfCells=\"0\">\n"
       "   <Cells>\n"
       "    <DataArray type=\"Int32\" name=\"connectivity\" format=\"ascii\">\n"
       "       0\n"
       "    </DataArray>\n"
       "    <DataArray type=\"Float32\" name=\"offset\" format=\"ascii\">\n"
       "       0\n"
       "    </DataArray>\n"
       "    <DataArray type=\"UInt8\" name=\"types\" format=\"ascii\">\n"
       "       1\n"
       "    </DataArray>\n"
       "   </Cells>\n"
       "   <Points>\n";
    Detail::VTKPointDescriptorEntry<T>* pDescr = descriptor_->positionEntry_;
    outFile_ << "<DataArray type=\"" << pDescr->getTypeName() << "\" "
                "NumberOfComponents=\"" << pDescr->getNumberOfComponents() << "\" "
                "format=\"ascii\">\n";
    for (const T& mem : container)
    {
      pDescr->emit(outFile_, mem);
    }
    outFile_ << "\n</DataArray>\n";
    
    outFile_ <<
      "    </Points>\n"
      "    <PointData>\n";
    
    for (Detail::VTKPointDescriptorEntry<T>* descr : descriptor_->entries_)
    {
      outFile_ << "<DataArray type=\""    << descr->getTypeName() << "\" "
                  "Name=\""               << descr->getName() << "\" "
                  "NumberOfComponents=\"" << descr->getNumberOfComponents() << "\" "
                  "format=\"ascii\">\n";
      for (const T& mem : container)
      {
        descr->emit(outFile_, mem);
      }
      outFile_ << "\n</DataArray>\n";
    }
    outFile_ <<
      "   </PointData>\n"
      "   <CellData/>\n"
      "  </Piece>\n"
      " </UnstructuredGrid>\n"
      "</VTKFile>\n";
  }